

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O1

void y_string_suite::y_string_unicode_U_plus_1FFFE_nonchar(void)

{
  char input [17];
  reader reader;
  undefined4 local_19c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  char local_178 [32];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_178,"[\"\\uD83F\\uDFFE\"]",0x11);
  local_198._M_dataplus._M_p = (pointer)strlen(local_178);
  local_198._M_string_length = (size_type)local_178;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,(view_type *)&local_198);
  local_19c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf54,"void y_string_suite::y_string_unicode_U_plus_1FFFE_nonchar()",&local_198,
             &local_19c);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_198._M_dataplus._M_p._0_4_ = local_158.decoder.current.code;
  local_19c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf56,"void y_string_suite::y_string_unicode_U_plus_1FFFE_nonchar()",&local_198,
             &local_19c);
  trial::protocol::json::basic_reader<char>::value<std::__cxx11::string>(&local_198,&local_158);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[7]>
            ("reader.value<std::string>()","\"\\xED\\xA0\\xBF\\xED\\xBF\\xBE\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf57,"void y_string_suite::y_string_unicode_U_plus_1FFFE_nonchar()",&local_198,
             anon_var_dwarf_5778);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_19c = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf59,"void y_string_suite::y_string_unicode_U_plus_1FFFE_nonchar()",&local_198,
             &local_19c);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_198._M_dataplus._M_p._0_4_ = local_158.decoder.current.code;
  local_19c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf5b,"void y_string_suite::y_string_unicode_U_plus_1FFFE_nonchar()",&local_198,
             &local_19c);
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void y_string_unicode_U_plus_1FFFE_nonchar()
{
    const char input[] = "[\"\\uD83F\\uDFFE\"]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "\xED\xA0\xBF\xED\xBF\xBE");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}